

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool operator==(CService *a,CService *b)

{
  uint16_t uVar1;
  uint16_t uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  direct_or_indirect local_68;
  uint local_58;
  undefined8 local_50;
  direct_or_indirect local_48;
  uint local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_48.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)a);
  local_30._0_4_ = (a->super_CNetAddr).m_net;
  local_30._4_4_ = (a->super_CNetAddr).m_scope_id;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_68.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)b);
  local_50._0_4_ = (b->super_CNetAddr).m_net;
  local_50._4_4_ = (b->super_CNetAddr).m_scope_id;
  if ((int)local_30 == (undefined4)local_50) {
    bVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator==
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       &local_48.indirect_contents,
                       (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       &local_68.indirect_contents);
  }
  else {
    bVar3 = false;
  }
  uVar1 = a->port;
  uVar2 = b->port;
  if (0x10 < local_58) {
    free(local_68.indirect_contents.indirect);
  }
  if (0x10 < local_38) {
    free(local_48.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)(bVar3 & uVar1 == uVar2);
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const CService& a, const CService& b)
{
    return static_cast<CNetAddr>(a) == static_cast<CNetAddr>(b) && a.port == b.port;
}